

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O2

void __thiscall
Js::JSONStringifier::SetStringGap(JSONStringifier *this,JavascriptString *spaceString)

{
  charcount_t cVar1;
  Recycler *this_00;
  char16_t *dest;
  char16 *src;
  uint uVar2;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  cVar1 = JavascriptString::GetLength(spaceString);
  uVar2 = 10;
  if (cVar1 < 10) {
    uVar2 = cVar1;
  }
  this->gapLength = uVar2;
  if (cVar1 != 0) {
    data.plusSize = (size_t)uVar2;
    local_50 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_68a3be2;
    data.filename._0_4_ = 0x1e;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (this->scriptContext->recycler,(TrackAllocData *)local_50);
    dest = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                      (ulong)this->gapLength);
    this->gap = dest;
    uVar2 = this->gapLength;
    src = JavascriptString::GetString(spaceString);
    wmemcpy_s(dest,(ulong)uVar2,src,(ulong)this->gapLength);
  }
  return;
}

Assistant:

void
JSONStringifier::SetStringGap(_In_ JavascriptString* spaceString)
{
    this->gapLength = min(MaxGapLength, spaceString->GetLength());
    if (this->gapLength != 0)
    {
        this->gap = RecyclerNewArrayLeaf(this->scriptContext->GetRecycler(), char16, this->gapLength);
        wmemcpy_s(gap, this->gapLength, spaceString->GetString(), this->gapLength);
    }
}